

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int lzip_has_member(archive_read_filter *filter)

{
  byte bVar1;
  int *piVar2;
  int log2dic;
  int bits_checked;
  ssize_t avail;
  uchar *buffer;
  archive_read_filter *filter_local;
  
  buffer = (uchar *)filter;
  piVar2 = (int *)__archive_read_filter_ahead(filter,6,(ssize_t *)&log2dic);
  if (piVar2 == (int *)0x0) {
    filter_local._4_4_ = 0;
  }
  else if (*piVar2 == 0x50495a4c) {
    if (((char)piVar2[1] == '\0') || ((char)piVar2[1] == '\x01')) {
      bVar1 = *(byte *)((long)piVar2 + 5) & 0x1f;
      if ((bVar1 < 0xc) || (0x1b < bVar1)) {
        filter_local._4_4_ = 0;
      }
      else {
        filter_local._4_4_ = 0x30;
      }
    }
    else {
      filter_local._4_4_ = 0;
    }
  }
  else {
    filter_local._4_4_ = 0;
  }
  return filter_local._4_4_;
}

Assistant:

static int
lzip_has_member(struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	int bits_checked;
	int log2dic;

	buffer = __archive_read_filter_ahead(filter, 6, &avail);
	if (buffer == NULL)
		return (0);

	/*
	 * Verify Header Magic Bytes : 4C 5A 49 50 (`LZIP')
	 */
	bits_checked = 0;
	if (memcmp(buffer, "LZIP", 4) != 0)
		return (0);
	bits_checked += 32;

	/* A version number must be 0 or 1 */
	if (buffer[4] != 0 && buffer[4] != 1)
		return (0);
	bits_checked += 8;

	/* Dictionary size. */
	log2dic = buffer[5] & 0x1f;
	if (log2dic < 12 || log2dic > 27)
		return (0);
	bits_checked += 8;

	return (bits_checked);
}